

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_57286f::FileSetType::WriteProperties<cmValue>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,cmValue value,
          bool clear)

{
  cmMakefile *pcVar1;
  string_view fileSetType;
  string_view sVar2;
  string *psVar3;
  cmTargetInternals *pcVar4;
  bool bVar5;
  ulong uVar6;
  cmAlphaNum local_5b8;
  size_t local_588;
  char *pcStack_580;
  cmAlphaNum local_578;
  string local_548;
  size_t local_528;
  char *local_520;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_518;
  cmAlphaNum local_508;
  size_t local_4d8;
  char *pcStack_4d0;
  cmAlphaNum local_4c8;
  string local_498;
  size_t local_478;
  char *local_470;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_468;
  cmAlphaNum local_458;
  size_t local_428;
  char *pcStack_420;
  cmAlphaNum local_418;
  string local_3e8;
  string_view local_3c8;
  size_t local_3b8;
  char *pcStack_3b0;
  cmValue local_3a0;
  cmAlphaNum local_398;
  size_t local_368;
  char *pcStack_360;
  cmAlphaNum local_358;
  string local_328;
  undefined1 local_308 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName_1;
  cmAlphaNum local_2c8;
  size_t local_298;
  char *pcStack_290;
  cmAlphaNum local_288;
  string local_258;
  string_view local_238;
  size_t local_228;
  char *pcStack_220;
  cmValue local_210;
  cmAlphaNum local_208;
  size_t local_1d8;
  char *pcStack_1d0;
  cmAlphaNum local_1c8;
  string local_198;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  allocator<char> local_109;
  string local_108;
  size_t local_e8;
  char *local_e0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d8;
  size_t local_c8;
  char *pcStack_c0;
  size_t local_b8;
  char *pcStack_b0;
  FileSetType *local_a0;
  allocator<char> local_81;
  string local_80;
  size_t local_60;
  char *local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  byte local_39;
  string *psStack_38;
  bool clear_local;
  string *prop_local;
  cmTargetInternals *impl_local;
  cmTarget *tgt_local;
  FileSetType *this_local;
  cmValue value_local;
  
  local_39 = clear;
  psStack_38 = prop;
  prop_local = (string *)impl;
  impl_local = (cmTargetInternals *)tgt;
  tgt_local = (cmTarget *)this;
  this_local = (FileSetType *)value.Value;
  local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  local_60 = (this->DefaultDirectoryProperty).super_string_view._M_len;
  local_58 = (this->DefaultDirectoryProperty).super_string_view._M_str;
  bVar5 = std::operator==(local_50,(this->DefaultDirectoryProperty).super_string_view);
  pcVar4 = impl_local;
  psVar3 = prop_local;
  if (bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_80,&this->TypeName,&local_81);
    local_a0 = this_local;
    local_b8 = (this->TypeName).super_string_view._M_len;
    pcStack_b0 = (this->TypeName).super_string_view._M_str;
    local_c8 = (this->DefaultDescription).super_string_view._M_len;
    pcStack_c0 = (this->DefaultDescription).super_string_view._M_str;
    cmTargetInternals::AddDirectoryToFileSet<cmValue>
              ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,&local_80,(cmValue)this_local,
               (this->TypeName).super_string_view,(this->DefaultDescription).super_string_view,
               (bool)(local_39 & 1));
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    value_local.Value._7_1_ = 1;
  }
  else {
    local_d8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38);
    local_e8 = (this->DefaultPathProperty).super_string_view._M_len;
    local_e0 = (this->DefaultPathProperty).super_string_view._M_str;
    bVar5 = std::operator==(local_d8,(this->DefaultPathProperty).super_string_view);
    pcVar4 = impl_local;
    psVar3 = prop_local;
    if (bVar5) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_108,&this->TypeName,&local_109);
      cmTargetInternals::AddPathToFileSet<cmValue>
                ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,&local_108,(cmValue)this_local,
                 (this->TypeName).super_string_view,(this->DefaultDescription).super_string_view,
                 (bool)(local_39 & 1));
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      value_local.Value._7_1_ = 1;
    }
    else {
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38);
      fileSetName.field_2._8_8_ = (this->DirectoryPrefix).super_string_view._M_len;
      bVar5 = cmHasPrefix(sVar2,(this->DirectoryPrefix).super_string_view);
      psVar3 = psStack_38;
      if (bVar5) {
        std::basic_string_view<char,_std::char_traits<char>_>::size
                  (&(this->DirectoryPrefix).super_string_view);
        std::__cxx11::string::substr((ulong)local_178,(ulong)psVar3);
        uVar6 = std::__cxx11::string::empty();
        pcVar4 = impl_local;
        psVar3 = prop_local;
        if ((uVar6 & 1) == 0) {
          local_210.Value = (string *)this_local;
          local_228 = (this->TypeName).super_string_view._M_len;
          pcStack_220 = (this->TypeName).super_string_view._M_str;
          local_298 = (this->ArbitraryDescription).super_string_view._M_len;
          pcStack_290 = (this->ArbitraryDescription).super_string_view._M_str;
          cmAlphaNum::cmAlphaNum(&local_288,(this->ArbitraryDescription).super_string_view);
          cmAlphaNum::cmAlphaNum(&local_2c8," \"");
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_258,&local_288,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     (char (*) [2])0xc88e37);
          local_238 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_258)
          ;
          sVar2._M_str = pcStack_220;
          sVar2._M_len = local_228;
          cmTargetInternals::AddDirectoryToFileSet<cmValue>
                    ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,(string *)local_178,local_210,
                     sVar2,local_238,(bool)(local_39 & 1));
          std::__cxx11::string::~string((string *)&local_258);
        }
        else {
          pcVar1 = (cmMakefile *)prop_local->_M_string_length;
          local_1d8 = (this->ArbitraryDescription).super_string_view._M_len;
          pcStack_1d0 = (this->ArbitraryDescription).super_string_view._M_str;
          cmAlphaNum::cmAlphaNum(&local_1c8,(this->ArbitraryDescription).super_string_view);
          cmAlphaNum::cmAlphaNum(&local_208," name cannot be empty.");
          cmStrCat<>(&local_198,&local_1c8,&local_208);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
        }
        value_local.Value._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_178);
      }
      else {
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38);
        fileSetName_1.field_2._8_8_ = (this->PathPrefix).super_string_view._M_len;
        bVar5 = cmHasPrefix(sVar2,(this->PathPrefix).super_string_view);
        psVar3 = psStack_38;
        if (bVar5) {
          std::basic_string_view<char,_std::char_traits<char>_>::size
                    (&(this->PathPrefix).super_string_view);
          std::__cxx11::string::substr((ulong)local_308,(ulong)psVar3);
          uVar6 = std::__cxx11::string::empty();
          pcVar4 = impl_local;
          psVar3 = prop_local;
          if ((uVar6 & 1) == 0) {
            local_3a0.Value = (string *)this_local;
            local_3b8 = (this->TypeName).super_string_view._M_len;
            pcStack_3b0 = (this->TypeName).super_string_view._M_str;
            local_428 = (this->ArbitraryDescription).super_string_view._M_len;
            pcStack_420 = (this->ArbitraryDescription).super_string_view._M_str;
            cmAlphaNum::cmAlphaNum(&local_418,(this->ArbitraryDescription).super_string_view);
            cmAlphaNum::cmAlphaNum(&local_458," \"");
            cmStrCat<std::__cxx11::string,char[2]>
                      (&local_3e8,&local_418,&local_458,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,(char (*) [2])0xc88e37);
            local_3c8 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_3e8);
            fileSetType._M_str = pcStack_3b0;
            fileSetType._M_len = local_3b8;
            cmTargetInternals::AddPathToFileSet<cmValue>
                      ((cmTargetInternals *)psVar3,(cmTarget *)pcVar4,(string *)local_308,local_3a0,
                       fileSetType,local_3c8,(bool)(local_39 & 1));
            std::__cxx11::string::~string((string *)&local_3e8);
          }
          else {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            local_368 = (this->ArbitraryDescription).super_string_view._M_len;
            pcStack_360 = (this->ArbitraryDescription).super_string_view._M_str;
            cmAlphaNum::cmAlphaNum(&local_358,(this->ArbitraryDescription).super_string_view);
            cmAlphaNum::cmAlphaNum(&local_398," name cannot be empty.");
            cmStrCat<>(&local_328,&local_358,&local_398);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_328);
            std::__cxx11::string::~string((string *)&local_328);
          }
          value_local.Value._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_308);
        }
        else {
          local_468 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_38)
          ;
          local_478 = (this->SelfEntries).PropertyName.super_string_view._M_len;
          local_470 = (this->SelfEntries).PropertyName.super_string_view._M_str;
          bVar5 = std::operator==(local_468,(this->SelfEntries).PropertyName.super_string_view);
          if (bVar5) {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            local_4d8 = (this->SelfEntries).PropertyName.super_string_view._M_len;
            pcStack_4d0 = (this->SelfEntries).PropertyName.super_string_view._M_str;
            cmAlphaNum::cmAlphaNum(&local_4c8,(this->SelfEntries).PropertyName.super_string_view);
            cmAlphaNum::cmAlphaNum(&local_508," property is read-only\n");
            cmStrCat<>(&local_498,&local_4c8,&local_508);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_498);
            std::__cxx11::string::~string((string *)&local_498);
            value_local.Value._7_1_ = 1;
          }
          else {
            local_518 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)psStack_38);
            local_528 = (this->InterfaceEntries).PropertyName.super_string_view._M_len;
            local_520 = (this->InterfaceEntries).PropertyName.super_string_view._M_str;
            bVar5 = std::operator==(local_518,
                                    (this->InterfaceEntries).PropertyName.super_string_view);
            if (bVar5) {
              pcVar1 = (cmMakefile *)prop_local->_M_string_length;
              local_588 = (this->InterfaceEntries).PropertyName.super_string_view._M_len;
              pcStack_580 = (this->InterfaceEntries).PropertyName.super_string_view._M_str;
              cmAlphaNum::cmAlphaNum
                        (&local_578,(this->InterfaceEntries).PropertyName.super_string_view);
              cmAlphaNum::cmAlphaNum(&local_5b8," property is read-only\n");
              cmStrCat<>(&local_548,&local_578,&local_5b8);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_548);
              std::__cxx11::string::~string((string *)&local_548);
              value_local.Value._7_1_ = 1;
            }
            else {
              value_local.Value._7_1_ = 0;
            }
          }
        }
      }
    }
  }
  return (bool)(value_local.Value._7_1_ & 1);
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}